

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int fts3tokNextMethod(sqlite3_vtab_cursor *pCursor)

{
  int iVar1;
  long *in_RDI;
  int rc;
  Fts3tokTable *pTab;
  Fts3tokCursor *pCsr;
  undefined4 in_stack_ffffffffffffffe0;
  
  *(int *)(in_RDI + 3) = (int)in_RDI[3] + 1;
  iVar1 = (**(code **)(*(long *)(*in_RDI + 0x18) + 0x28))
                    (in_RDI[2],in_RDI + 4,in_RDI + 5,(long)in_RDI + 0x2c,in_RDI + 6,
                     (long)in_RDI + 0x34);
  if ((iVar1 != 0) &&
     (fts3tokResetCursor((Fts3tokCursor *)CONCAT44(iVar1,in_stack_ffffffffffffffe0)), iVar1 == 0x65)
     ) {
    iVar1 = 0;
  }
  return iVar1;
}

Assistant:

static int fts3tokNextMethod(sqlite3_vtab_cursor *pCursor){
  Fts3tokCursor *pCsr = (Fts3tokCursor *)pCursor;
  Fts3tokTable *pTab = (Fts3tokTable *)(pCursor->pVtab);
  int rc;                         /* Return code */

  pCsr->iRowid++;
  rc = pTab->pMod->xNext(pCsr->pCsr,
      &pCsr->zToken, &pCsr->nToken,
      &pCsr->iStart, &pCsr->iEnd, &pCsr->iPos
  );

  if( rc!=SQLITE_OK ){
    fts3tokResetCursor(pCsr);
    if( rc==SQLITE_DONE ) rc = SQLITE_OK;
  }

  return rc;
}